

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# current_setting.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CurrentSettingBindData::Copy(CurrentSettingBindData *this)

{
  _func_int **in_RAX;
  long in_RSI;
  _func_int **local_18;
  
  local_18 = in_RAX;
  make_uniq<duckdb::CurrentSettingBindData,duckdb::Value_const&>
            ((duckdb *)&local_18,(Value *)(in_RSI + 8));
  (this->super_FunctionData)._vptr_FunctionData = local_18;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<CurrentSettingBindData>(value);
	}